

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::
PropagateDateTruncStatistics<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::QuarterOperator>
          (duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  bool bVar1;
  date_t dVar2;
  date_t dVar3;
  reference pvVar4;
  BaseStatistics result;
  Value min_value;
  Value max_value;
  LogicalType local_110;
  BaseStatistics local_f8;
  Value local_a0;
  Value local_60;
  
  this_00 = input->child_stats;
  pvVar4 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,1);
  bVar1 = NumericStats::HasMinMax(pvVar4);
  if (bVar1) {
    dVar2 = NumericStats::GetMin<duckdb::date_t>(pvVar4);
    dVar3 = NumericStats::GetMax<duckdb::date_t>(pvVar4);
    if (dVar2.days <= dVar3.days) {
      dVar2 = DateTrunc::
              UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::QuarterOperator>(dVar2)
      ;
      dVar3 = DateTrunc::
              UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::QuarterOperator>(dVar3)
      ;
      Value::CreateValue<duckdb::date_t>(&local_a0,dVar2);
      Value::CreateValue<duckdb::date_t>(&local_60,dVar3);
      LogicalType::LogicalType(&local_110,&local_a0.type_);
      NumericStats::CreateEmpty(&local_f8,&local_110);
      LogicalType::~LogicalType(&local_110);
      NumericStats::SetMin(&local_f8,&local_a0);
      NumericStats::SetMax(&local_f8,&local_60);
      pvVar4 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
      BaseStatistics::CopyValidity(&local_f8,pvVar4);
      BaseStatistics::ToUnique((BaseStatistics *)this);
      BaseStatistics::~BaseStatistics(&local_f8);
      Value::~Value(&local_60);
      Value::~Value(&local_a0);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDateTruncStatistics(ClientContext &context, FunctionStatisticsInput &input) {
	return DateTruncStatistics<TA, TR, OP>(input.child_stats);
}